

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

string * bssl::anon_unknown_12::BuildAttrName(string *__return_storage_ptr__,string *name,int iter)

{
  string local_68;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int iter_local;
  string *name_local;
  
  local_41 = 0;
  local_1c = iter;
  psStack_18 = name;
  name_local = __return_storage_ptr__;
  if (iter == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  else {
    std::operator+(&local_40,name,"/");
    local_41 = 1;
    std::__cxx11::to_string(&local_68,local_1c);
    std::operator+(__return_storage_ptr__,&local_40,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BuildAttrName(const std::string &name, int iter) {
  return iter == 1 ? name : name + "/" + std::to_string(iter);
}